

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeSet::UnicodeSet(UnicodeSet *this,UnicodeSet *o,UBool param_2)

{
  int iVar1;
  UChar32 *__dest;
  UErrorCode status;
  UErrorCode local_54;
  UnicodeString local_50;
  
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_003b50a0;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_003b51b8;
  this->len = 0;
  this->capacity = o->len + 0x10;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  *(undefined8 *)((long)&this->strings + 1) = 0;
  *(undefined8 *)((long)&this->stringSpan + 1) = 0;
  local_54 = U_ZERO_ERROR;
  allocateStrings(this,&local_54);
  if (local_54 < U_ILLEGAL_ARGUMENT_ERROR) {
    __dest = (UChar32 *)uprv_malloc_63((long)this->capacity << 2);
    this->list = __dest;
    if (__dest == (UChar32 *)0x0) {
      clear(this);
    }
    else {
      iVar1 = o->len;
      this->len = iVar1;
      memcpy(__dest,o->list,(long)iVar1 << 2);
      if ((this->strings != (UVector *)0x0) && (o->strings != (UVector *)0x0)) {
        UVector::assign(this->strings,o->strings,cloneUnicodeString,&local_54);
        if (o->pat == (UChar *)0x0) {
          return;
        }
        UnicodeString::UnicodeString(&local_50,o->pat,o->patLen);
        setPattern(this,&local_50);
        UnicodeString::~UnicodeString(&local_50);
        return;
      }
      clear(this);
    }
  }
  else {
    clear(this);
  }
  this->fFlags = '\x01';
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const UnicodeSet& o, UBool /* asThawed */) :
    UnicodeFilter(o),
    len(0), capacity(o.len + GROW_EXTRA), list(0),
    bmpSet(0),
    buffer(0), bufferCapacity(0),
    patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0)
{
    UErrorCode status = U_ZERO_ERROR;
    allocateStrings(status);
    if (U_FAILURE(status)) {
        setToBogus(); // If memory allocation failed, set to bogus state.
        return;
    }
    list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
    if(list!=NULL){
        // *this = o except for bmpSet and stringSpan
        len = o.len;
        uprv_memcpy(list, o.list, (size_t)len*sizeof(UChar32));
        if (strings != NULL && o.strings != NULL) {
            strings->assign(*o.strings, cloneUnicodeString, status);
        } else { // Invalid strings.
            setToBogus();
            return;
        }
        if (o.pat) {
            setPattern(UnicodeString(o.pat, o.patLen));
        }
    } else { // If memory allocation failed, set to bogus state.
        setToBogus();
        return;
    }
    _dbgct(this);
}